

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

LY_ERR ly_set_add(ly_set *set,void *object,ly_bool list,uint32_t *index_p)

{
  uint uVar1;
  lyd_node **pplVar2;
  uint local_3c;
  uint32_t i;
  void **new;
  uint32_t *index_p_local;
  ly_bool list_local;
  void *object_local;
  ly_set *set_local;
  
  if (set == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set","ly_set_add");
    set_local._4_4_ = LY_EINVAL;
  }
  else {
    if (list == '\0') {
      for (local_3c = 0; local_3c < set->count; local_3c = local_3c + 1) {
        if ((set->field_2).dnodes[local_3c] == (lyd_node *)object) {
          if (index_p != (uint32_t *)0x0) {
            *index_p = local_3c;
          }
          return LY_SUCCESS;
        }
      }
    }
    if (set->size == set->count) {
      pplVar2 = (lyd_node **)realloc((set->field_2).dnodes,(ulong)(set->size + 8) << 3);
      if (pplVar2 == (lyd_node **)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_add");
        return LY_EMEM;
      }
      set->size = set->size + 8;
      (set->field_2).dnodes = pplVar2;
    }
    if (index_p != (uint32_t *)0x0) {
      *index_p = set->count;
    }
    uVar1 = set->count;
    set->count = uVar1 + 1;
    (set->field_2).dnodes[uVar1] = (lyd_node *)object;
    set_local._4_4_ = LY_SUCCESS;
  }
  return set_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_add(struct ly_set *set, const void *object, ly_bool list, uint32_t *index_p)
{
    void **new;

    LY_CHECK_ARG_RET(NULL, set, LY_EINVAL);

    if (!list) {
        /* search for duplication */
        for (uint32_t i = 0; i < set->count; i++) {
            if (set->objs[i] == object) {
                /* already in set */
                if (index_p) {
                    *index_p = i;
                }
                return LY_SUCCESS;
            }
        }
    }

    if (set->size == set->count) {
#define SET_SIZE_STEP 8
        new = realloc(set->objs, (set->size + SET_SIZE_STEP) * sizeof *(set->objs));
        LY_CHECK_ERR_RET(!new, LOGMEM(NULL), LY_EMEM);
        set->size += SET_SIZE_STEP;
        set->objs = new;
#undef SET_SIZE_STEP
    }

    if (index_p) {
        *index_p = set->count;
    }
    set->objs[set->count++] = (void *)object;

    return LY_SUCCESS;
}